

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream * QtPrivate::writeSequentialContainer<QList<QString>>(QDataStream *s,QList<QString> *c)

{
  bool bVar1;
  value_type *t;
  QString *pQVar2;
  long lVar3;
  
  bVar1 = QDataStream::writeQSizeType(s,(c->d).size);
  if (bVar1) {
    pQVar2 = (c->d).ptr;
    for (lVar3 = (c->d).size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      ::operator<<(s,(QString *)pQVar2);
      pQVar2 = pQVar2 + 1;
    }
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}